

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spolynomials.cpp
# Opt level: O0

void opengv::absolute_pose::modules::gpnp4::sPolynomial22
               (Matrix<double,_25,_37,_0,_25,_37> *groebnerMatrix)

{
  double dVar1;
  double dVar2;
  Scalar *pSVar3;
  double dVar4;
  double dVar5;
  Index in_stack_fffffffffffffe88;
  Scalar row;
  DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1> *in_stack_fffffffffffffe90;
  DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1> *this;
  
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,0x935f96);
  row = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (in_stack_fffffffffffffe90,(Index)row,0x935fb6);
  dVar4 = row / *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (in_stack_fffffffffffffe90,(Index)row,0x935fdc);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1> *)*pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x935ffd);
  dVar5 = (double)this / *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x93602e);
  *pSVar3 = dVar4 - dVar5;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x93604f);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x936070);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x936097);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9360b8);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9360e9);
  *pSVar3 = dVar4 / dVar5 - dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x93610a);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x93612b);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x936152);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x936173);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9361a4);
  *pSVar3 = dVar4 / dVar5 - dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9361c5);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9361e6);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x93620d);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x93622e);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x93625f);
  *pSVar3 = dVar4 / dVar5 - dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x936280);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9362a4);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9362d1);
  *pSVar3 = dVar4 / dVar5;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9362f5);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x936319);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x936346);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x93636a);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9363a4);
  *pSVar3 = dVar4 / dVar5 - dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9363c8);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9363ec);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x936419);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x93643d);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x936477);
  *pSVar3 = dVar4 / dVar5 - dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x93649b);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9364bf);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9364ec);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x936510);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x93654a);
  *pSVar3 = dVar4 / dVar5 - dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x93656e);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x936592);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9365bf);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9365e3);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x93661d);
  *pSVar3 = dVar4 / dVar5 - dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x936641);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x936665);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x936692);
  *pSVar3 = dVar4 / dVar5;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9366b6);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9366da);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x936707);
  *pSVar3 = dVar4 / dVar5;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x93672b);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x93674f);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x93677c);
  *pSVar3 = dVar4 / dVar5;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9367a0);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9367c4);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9367f1);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x936815);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x93684f);
  *pSVar3 = dVar4 / dVar5 - dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x936873);
  dVar4 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x936897);
  dVar5 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>,_1>::operator()
                     (this,(Index)row,0x9368c4);
  *pSVar3 = dVar4 / dVar5;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp4::sPolynomial22( Eigen::Matrix<double,25,37> & groebnerMatrix )
{
  groebnerMatrix(22,18) = (groebnerMatrix(10,18)/(groebnerMatrix(10,17))-groebnerMatrix(15,28)/(groebnerMatrix(15,27)));
  groebnerMatrix(22,19) = (groebnerMatrix(10,19)/(groebnerMatrix(10,17))-groebnerMatrix(15,29)/(groebnerMatrix(15,27)));
  groebnerMatrix(22,20) = (groebnerMatrix(10,20)/(groebnerMatrix(10,17))-groebnerMatrix(15,30)/(groebnerMatrix(15,27)));
  groebnerMatrix(22,21) = (groebnerMatrix(10,21)/(groebnerMatrix(10,17))-groebnerMatrix(15,31)/(groebnerMatrix(15,27)));
  groebnerMatrix(22,27) = groebnerMatrix(10,27)/(groebnerMatrix(10,17));
  groebnerMatrix(22,28) = (groebnerMatrix(10,28)/(groebnerMatrix(10,17))-groebnerMatrix(15,32)/(groebnerMatrix(15,27)));
  groebnerMatrix(22,29) = (groebnerMatrix(10,29)/(groebnerMatrix(10,17))-groebnerMatrix(15,33)/(groebnerMatrix(15,27)));
  groebnerMatrix(22,30) = (groebnerMatrix(10,30)/(groebnerMatrix(10,17))-groebnerMatrix(15,34)/(groebnerMatrix(15,27)));
  groebnerMatrix(22,31) = (groebnerMatrix(10,31)/(groebnerMatrix(10,17))-groebnerMatrix(15,35)/(groebnerMatrix(15,27)));
  groebnerMatrix(22,32) = groebnerMatrix(10,32)/(groebnerMatrix(10,17));
  groebnerMatrix(22,33) = groebnerMatrix(10,33)/(groebnerMatrix(10,17));
  groebnerMatrix(22,34) = groebnerMatrix(10,34)/(groebnerMatrix(10,17));
  groebnerMatrix(22,35) = (groebnerMatrix(10,35)/(groebnerMatrix(10,17))-groebnerMatrix(15,36)/(groebnerMatrix(15,27)));
  groebnerMatrix(22,36) = groebnerMatrix(10,36)/(groebnerMatrix(10,17));
}